

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkInter(Abc_Ntk_t *pNtkOn,Abc_Ntk_t *pNtkOff,int fRelation,int fVerbose)

{
  Abc_Ntk_t *pAVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  int iVar5;
  
  iVar5 = pNtkOn->vCos->nSize;
  if (iVar5 == pNtkOff->vCos->nSize) {
    if (iVar5 == 1) {
      pAVar1 = Abc_NtkInterOne(pNtkOn,pNtkOff,fRelation,fVerbose);
      return pAVar1;
    }
    pAVar1 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pcVar2 = Extra_UtilStrsav(pNtkOn->pName);
    pAVar1->pName = pcVar2;
    for (iVar5 = 0; iVar5 < pNtkOn->vPis->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkPi(pNtkOn,iVar5);
      Abc_NtkDupObj(pAVar1,pAVar3,1);
    }
    timeCnf = 0;
    timeSat = 0;
    timeInt = 0;
    for (iVar5 = 0; iVar5 < pNtkOn->vCos->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkCo(pNtkOn,iVar5);
      pAVar3 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
      pcVar2 = Abc_ObjName(pAVar4);
      pNtk = Abc_NtkCreateCone(pNtkOn,pAVar3,pcVar2,1);
      if ((pAVar4->field_0x15 & 4) != 0) {
        pAVar3 = Abc_NtkPo(pNtk,0);
        pAVar3->field_0x15 = pAVar3->field_0x15 ^ 4;
      }
      pAVar4 = Abc_NtkCo(pNtkOff,iVar5);
      pAVar3 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
      pcVar2 = Abc_ObjName(pAVar4);
      pNtk_00 = Abc_NtkCreateCone(pNtkOff,pAVar3,pcVar2,1);
      if ((pAVar4->field_0x15 & 4) != 0) {
        pAVar3 = Abc_NtkPo(pNtk_00,0);
        pAVar3->field_0x15 = pAVar3->field_0x15 ^ 4;
      }
      if (pNtk->nObjCounts[7] == 0) {
        pNtk_01 = Abc_NtkDup(pNtk);
      }
      else if (pNtk_00->nObjCounts[7] == 0) {
        pNtk_01 = Abc_NtkDup(pNtk_00);
        pAVar3 = Abc_NtkPo(pNtk_01,0);
        pAVar3->field_0x15 = pAVar3->field_0x15 ^ 4;
      }
      else {
        pNtk_01 = Abc_NtkInterOne(pNtk,pNtk_00,0,fVerbose);
      }
      if (pNtk_01 != (Abc_Ntk_t *)0x0) {
        Abc_NtkAppend(pAVar1,pNtk_01,1);
        Abc_NtkDelete(pNtk_01);
      }
      Abc_NtkDelete(pNtk);
      Abc_NtkDelete(pNtk_00);
    }
    pNtkOn = pAVar1;
    iVar5 = Abc_NtkCheck(pAVar1);
    if (iVar5 != 0) {
      return pAVar1;
    }
    pcVar2 = "Abc_NtkAttachBottom(): Network check has failed.\n";
  }
  else {
    pcVar2 = "Currently works only for networks with equal number of POs.\n";
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  Abc_Print((int)pNtkOn,pcVar2);
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkInter( Abc_Ntk_t * pNtkOn, Abc_Ntk_t * pNtkOff, int fRelation, int fVerbose )
{
    Abc_Ntk_t * pNtkOn1, * pNtkOff1, * pNtkInter1, * pNtkInter;
    Abc_Obj_t * pObj;
    int i; //, clk = Abc_Clock();
    if ( Abc_NtkCoNum(pNtkOn) != Abc_NtkCoNum(pNtkOff) )
    {
        Abc_Print( 1, "Currently works only for networks with equal number of POs.\n" );
        return NULL;
    }
    // compute the fast interpolation time
//    Abc_NtkInterFast( pNtkOn, pNtkOff, fVerbose );
    // consider the case of one output
    if ( Abc_NtkCoNum(pNtkOn) == 1 )
        return Abc_NtkInterOne( pNtkOn, pNtkOff, fRelation, fVerbose );
    // start the new network
    pNtkInter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkInter->pName = Extra_UtilStrsav(pNtkOn->pName);
    Abc_NtkForEachPi( pNtkOn, pObj, i )
        Abc_NtkDupObj( pNtkInter, pObj, 1 );
    // process each POs separately
timeCnf = 0;
timeSat = 0;
timeInt = 0;
    Abc_NtkForEachCo( pNtkOn, pObj, i )
    {
        pNtkOn1 = Abc_NtkCreateCone( pNtkOn, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 1 );
        if ( Abc_ObjFaninC0(pObj) )
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkOn1, 0), 0 );

        pObj   = Abc_NtkCo(pNtkOff, i);
        pNtkOff1 = Abc_NtkCreateCone( pNtkOff, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 1 );
        if ( Abc_ObjFaninC0(pObj) )
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkOff1, 0), 0 );

        if ( Abc_NtkNodeNum(pNtkOn1) == 0 )
            pNtkInter1 = Abc_NtkDup( pNtkOn1 );
        else if ( Abc_NtkNodeNum(pNtkOff1) == 0 )
        {
            pNtkInter1 = Abc_NtkDup( pNtkOff1 );
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkInter1, 0), 0 );
        }
        else
            pNtkInter1 = Abc_NtkInterOne( pNtkOn1, pNtkOff1, 0, fVerbose );
        if ( pNtkInter1 )
        {
            Abc_NtkAppend( pNtkInter, pNtkInter1, 1 );
            Abc_NtkDelete( pNtkInter1 );
        }

        Abc_NtkDelete( pNtkOn1 );
        Abc_NtkDelete( pNtkOff1 );
    }
//    ABC_PRT( "CNF", timeCnf );
//    ABC_PRT( "SAT", timeSat );
//    ABC_PRT( "Int", timeInt );
//    ABC_PRT( "Slow interpolation time", Abc_Clock() - clk );

    // return the network
    if ( !Abc_NtkCheck( pNtkInter ) )
        Abc_Print( 1, "Abc_NtkAttachBottom(): Network check has failed.\n" );
    return pNtkInter;
}